

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall
SQCompiler::SQCompiler
          (SQCompiler *this,SQVM *v,SQLEXREADFUNC rg,SQUserPointer up,SQChar *sourcename,
          bool raiseerror,bool lineinfo)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQString *pSVar4;
  
  (this->_sourcename).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_sourcename).super_SQObject._type = OT_NULL;
  SQLexer::SQLexer(&this->_lex);
  this->_vm = v;
  SQLexer::Init(&this->_lex,v->_sharedstate,rg,up,ThrowError,this);
  pSVar4 = SQString::Create(v->_sharedstate,sourcename,-1);
  pSVar3 = (this->_sourcename).super_SQObject._unVal.pTable;
  SVar2 = (this->_sourcename).super_SQObject._type;
  (this->_sourcename).super_SQObject._type = OT_STRING;
  (this->_sourcename).super_SQObject._unVal.pString = pSVar4;
  pSVar1 = &(pSVar4->super_SQRefCounted)._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this->_lineinfo = lineinfo;
  this->_raiseerror = raiseerror;
  (this->_scope).outers = 0;
  (this->_scope).stacksize = 0;
  this->_compilererror[0] = '\0';
  return;
}

Assistant:

SQCompiler(SQVM *v, SQLEXREADFUNC rg, SQUserPointer up, const SQChar* sourcename, bool raiseerror, bool lineinfo)
    {
        _vm=v;
        _lex.Init(_ss(v), rg, up,ThrowError,this);
        _sourcename = SQString::Create(_ss(v), sourcename);
        _lineinfo = lineinfo;_raiseerror = raiseerror;
        _scope.outers = 0;
        _scope.stacksize = 0;
        _compilererror[0] = _SC('\0');
    }